

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall ExampleModel::DefVarsInItem(ExampleModel *this,int i)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  undefined4 in_EDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar2;
  iterator in_stack_ffffffffffffffa8;
  iterator piVar3;
  size_type in_stack_ffffffffffffffb0;
  size_type sVar4;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 *local_28;
  undefined8 local_20;
  
  switch(in_EDX) {
  case 0:
    local_30 = 0;
    local_2c = 1;
    local_28 = &local_30;
    local_20 = 2;
    std::allocator<int>::allocator((allocator<int> *)0x10e6ab);
    __l._M_len = in_stack_ffffffffffffffb0;
    __l._M_array = in_stack_ffffffffffffffa8;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__l,
               in_stack_ffffffffffffff98);
    std::allocator<int>::~allocator((allocator<int> *)0x10e6d0);
    break;
  case 1:
  case 3:
    memset(in_RDI,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10e70d);
    break;
  case 2:
    iVar1 = 2;
    uVar2 = 3;
    piVar3 = (iterator)&stack0xffffffffffffffa0;
    sVar4 = 2;
    std::allocator<int>::allocator((allocator<int> *)0x10e744);
    __l_00._M_len = sVar4;
    __l_00._M_array = piVar3;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar2,iVar1),__l_00,
               in_stack_ffffffffffffff98);
    std::allocator<int>::~allocator((allocator<int> *)0x10e769);
    break;
  case 0xffffffff:
    memset(in_RDI,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10e674);
    break;
  default:
    memset(in_RDI,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10e7a0);
  }
  return in_RDI;
}

Assistant:

std::vector<int> DefVarsInItem(int i) const {
    switch (i) {
    case -1: return {};
    case 0: return {0, 1};
    case 1:
    case 3: return {};
    case 2: return {2, 3};
    default:
      assert(0);
      return {};
    }
  }